

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void ggml::cpu::aarch64::gemv<block_q4_0,8l,8l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  int in_stack_00000394;
  void *in_stack_00000398;
  void *in_stack_000003a0;
  size_t in_stack_000003a8;
  float *in_stack_000003b0;
  int in_stack_000003b8;
  int in_stack_ffffffffffffffd0;
  
  ggml_gemv_q4_0_8x8_q8_0
            (in_stack_000003b8,in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,
             in_stack_00000398,in_stack_00000394,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void gemv<block_q4_0, 8, 8, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_8x8_q8_0(n, s, bs, vx, vy, nr, nc);
}